

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O1

bool __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::Uint64(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
         *this,uint64_t i)

{
  uint64_t *puVar1;
  
  if ((this->stack_).stackEnd_ < (this->stack_).stackTop_ + 0x10) {
    internal::Stack<rapidjson::CrtAllocator>::
    Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
              (&this->stack_,1);
  }
  puVar1 = (uint64_t *)(this->stack_).stackTop_;
  (this->stack_).stackTop_ = (char *)(puVar1 + 2);
  *puVar1 = 0;
  puVar1[1] = 0;
  *puVar1 = i;
  *(ushort *)((long)puVar1 + 0xe) =
       (ushort)((i & 0xffffffff80000000) == 0) * 0x20 +
       ((ushort)(i >> 0x20 == 0) << 6 | (ushort)(-1 < (long)i) << 7) + 0x116;
  return true;
}

Assistant:

bool Uint64(uint64_t i) { new (stack_.template Push<ValueType>()) ValueType(i); return true; }